

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int archive_read_format_rar_bid(archive_read *a,int best_bid)

{
  long in_RAX;
  int *piVar1;
  void *pvVar2;
  int iVar3;
  size_t min;
  ulong uVar4;
  long lVar5;
  ssize_t window;
  ulong uVar6;
  ssize_t bytes_avail;
  long local_38;
  
  iVar3 = -1;
  if ((best_bid < 0x1f) &&
     (local_38 = in_RAX, piVar1 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0),
     piVar1 != (int *)0x0)) {
    if (*(int *)((long)piVar1 + 3) == 0x71a21 && *piVar1 == 0x21726152) {
LAB_00177a61:
      iVar3 = 0x1e;
    }
    else if ((((char)*piVar1 == 'M') && (*(char *)((long)piVar1 + 1) == 'Z')) ||
            (iVar3 = 0, *piVar1 == 0x464c457f)) {
      lVar5 = 0x10000;
      uVar6 = 0x1000;
      min = 0x11000;
      do {
        pvVar2 = __archive_read_ahead(a,min,&local_38);
        if (pvVar2 == (void *)0x0) {
          uVar6 = (long)uVar6 >> 1;
          if (uVar6 < 0x40) break;
        }
        else {
          uVar4 = (long)pvVar2 + lVar5 + 7;
          piVar1 = (int *)((long)pvVar2 + lVar5);
          while (uVar4 < (ulong)(local_38 + (long)pvVar2)) {
            if (*(int *)((long)piVar1 + 3) == 0x71a21 && *piVar1 == 0x21726152) goto LAB_00177a61;
            uVar4 = (long)piVar1 + 0x17;
            piVar1 = piVar1 + 4;
          }
          lVar5 = (long)piVar1 - (long)pvVar2;
        }
        min = uVar6 + lVar5;
      } while ((long)min < 0x20001);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
archive_read_format_rar_bid(struct archive_read *a, int best_bid)
{
  const char *p;

  /* If there's already a bid > 30, we'll never win. */
  if (best_bid > 30)
	  return (-1);

  if ((p = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (-1);

  if (memcmp(p, RAR_SIGNATURE, 7) == 0)
    return (30);

  if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
    /* This is a PE file */
    ssize_t offset = 0x10000;
    ssize_t window = 4096;
    ssize_t bytes_avail;
    while (offset + window <= (1024 * 128)) {
      const char *buff = __archive_read_ahead(a, offset + window, &bytes_avail);
      if (buff == NULL) {
        /* Remaining bytes are less than window. */
        window >>= 1;
        if (window < 0x40)
          return (0);
        continue;
      }
      p = buff + offset;
      while (p + 7 < buff + bytes_avail) {
        if (memcmp(p, RAR_SIGNATURE, 7) == 0)
          return (30);
        p += 0x10;
      }
      offset = p - buff;
    }
  }
  return (0);
}